

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  int iVar2;
  ImFontConfig *pIVar3;
  ImFont **ppIVar4;
  long lVar5;
  ImFontAtlasCustomRect *ptr;
  long lVar6;
  long lVar7;
  
  lVar6 = (long)(this->ConfigData).Size;
  if (lVar6 != 0) {
    pIVar3 = (this->ConfigData).Data;
    lVar7 = 0;
    do {
      if ((*(void **)(pIVar3->Name + lVar7 + -0x5a) != (void *)0x0) &&
         (pIVar3->Name[lVar7 + -0x4e] == '\x01')) {
        ImGui::MemFree(*(void **)(pIVar3->Name + lVar7 + -0x5a));
        pcVar1 = pIVar3->Name + lVar7 + -0x5a;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      lVar7 = lVar7 + 0x90;
    } while (lVar6 * 0x90 != lVar7);
  }
  lVar6 = (long)(this->Fonts).Size;
  if (lVar6 != 0) {
    ppIVar4 = (this->Fonts).Data;
    pIVar3 = (this->ConfigData).Data;
    iVar2 = (this->ConfigData).Size;
    lVar7 = 0;
    do {
      lVar5 = *(long *)((long)ppIVar4 + lVar7);
      if ((pIVar3 <= *(ImFontConfig **)(lVar5 + 0x48)) &&
         (*(ImFontConfig **)(lVar5 + 0x48) < pIVar3 + iVar2)) {
        *(undefined8 *)(lVar5 + 0x48) = 0;
        *(undefined2 *)(lVar5 + 0x50) = 0;
      }
      lVar7 = lVar7 + 8;
    } while (lVar6 * 8 != lVar7);
  }
  pIVar3 = (this->ConfigData).Data;
  if (pIVar3 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar3);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (ImFontConfig& font_cfg : ConfigData)
        if (font_cfg.FontData && font_cfg.FontDataOwnedByAtlas)
        {
            IM_FREE(font_cfg.FontData);
            font_cfg.FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (ImFont* font : Fonts)
        if (font->ConfigData >= ConfigData.Data && font->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            font->ConfigData = NULL;
            font->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}